

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O1

QAbstractItemModel * createTreeModel(QObject *parent)

{
  int iVar1;
  QStandardItemModel *this;
  ulong uVar2;
  ulong uVar3;
  QModelIndex parIdx;
  ulong local_e8;
  QArrayData *local_e0;
  char16_t *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  anon_union_24_3_e3d07ef4_for_data local_b0;
  QArrayData *local_90 [3];
  QString local_78;
  QArrayData *local_60;
  char16_t *local_58;
  undefined8 local_50;
  undefined1 local_48 [24];
  
  this = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this,parent);
  local_b0._forAlignment = -NAN;
  local_b0._8_8_ = 0;
  local_b0._16_8_ = 0;
  (**(code **)(*(long *)this + 0xf8))(this,0,5,&local_b0);
  local_b0._forAlignment = -NAN;
  local_b0._8_8_ = 0;
  local_b0._16_8_ = 0;
  (**(code **)(*(long *)this + 0x100))(this,0,3,&local_b0);
  local_b0._forAlignment = -NAN;
  local_b0._8_8_ = 0;
  local_b0._16_8_ = 0;
  iVar1 = (**(code **)(*(long *)this + 0x78))(this,&local_b0);
  if (0 < iVar1) {
    uVar2 = 0;
    do {
      local_b0._forAlignment = -NAN;
      local_b0._8_8_ = 0;
      local_b0._16_8_ = 0;
      iVar1 = (**(code **)(*(long *)this + 0x80))(this,&local_b0);
      local_e8 = uVar2;
      if (0 < iVar1) {
        uVar2 = 0;
        do {
          uVar3 = local_e8;
          local_c8 = 0xffffffffffffffff;
          local_c0 = 0;
          uStack_b8 = 0;
          (**(code **)(*(long *)this + 0x60))
                    (local_48,this,local_e8 & 0xffffffff,uVar2 & 0xffffffff,&local_c8);
          local_e0 = (QArrayData *)0x0;
          local_d8 = L"%1,%2";
          local_d0 = 5;
          QString::arg((longlong)local_90,(int)&local_e8 + 8,(int)uVar3,(QChar)0x0);
          QString::arg((longlong)&local_78,(int)local_90,(int)uVar2,(QChar)0x0);
          QVariant::QVariant((QVariant *)&local_b0,&local_78);
          (**(code **)(*(long *)this + 0x98))(this,local_48,&local_b0,2);
          QVariant::~QVariant((QVariant *)&local_b0);
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
            }
          }
          if (local_90[0] != (QArrayData *)0x0) {
            LOCK();
            (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_90[0],2,8);
            }
          }
          if (local_e0 != (QArrayData *)0x0) {
            LOCK();
            (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_e0,2,8);
            }
          }
          uVar3 = local_e8;
          local_c8 = 0xffffffffffffffff;
          local_c0 = 0;
          uStack_b8 = 0;
          iVar1 = (int)local_e8;
          (**(code **)(*(long *)this + 0x60))
                    (local_48,this,local_e8 & 0xffffffff,uVar2 & 0xffffffff,&local_c8);
          QVariant::QVariant((QVariant *)&local_b0,iVar1);
          (**(code **)(*(long *)this + 0x98))(this,local_48,&local_b0,0x100);
          QVariant::~QVariant((QVariant *)&local_b0);
          local_c8 = 0xffffffffffffffff;
          local_c0 = 0;
          uStack_b8 = 0;
          (**(code **)(*(long *)this + 0x60))
                    (local_48,this,uVar3 & 0xffffffff,uVar2 & 0xffffffff,&local_c8);
          QVariant::QVariant((QVariant *)&local_b0,(int)uVar2);
          (**(code **)(*(long *)this + 0x98))(this,local_48,&local_b0,0x101);
          QVariant::~QVariant((QVariant *)&local_b0);
          uVar2 = uVar2 + 1;
          local_b0._forAlignment = -NAN;
          local_b0._8_8_ = 0;
          local_b0._16_8_ = 0;
          iVar1 = (**(code **)(*(long *)this + 0x80))(this,&local_b0);
        } while ((long)uVar2 < (long)iVar1);
      }
      local_b0._forAlignment = -NAN;
      local_b0._8_8_ = 0;
      local_b0._16_8_ = 0;
      (**(code **)(*(long *)this + 0x60))(local_48,this,local_e8,0,&local_b0);
      (**(code **)(*(long *)this + 0xf8))(this,0,5,local_48);
      (**(code **)(*(long *)this + 0x100))(this,0,3);
      iVar1 = (**(code **)(*(long *)this + 0x78))(this,local_48);
      if (0 < iVar1) {
        uVar2 = 0;
        do {
          iVar1 = (**(code **)(*(long *)this + 0x80))(this,local_48);
          if (0 < iVar1) {
            uVar3 = 0;
            do {
              (**(code **)(*(long *)this + 0x60))
                        (&local_c8,this,uVar2 & 0xffffffff,uVar3 & 0xffffffff,local_48);
              local_60 = (QArrayData *)0x0;
              local_58 = L"%1,%2,%3";
              local_50 = 8;
              QString::arg((longlong)&local_e0,(int)&local_60,(int)local_e8,(QChar)0x0);
              QString::arg((longlong)local_90,(int)&local_e0,(int)uVar2,(QChar)0x0);
              QString::arg((longlong)&local_78,(int)local_90,(int)uVar3,(QChar)0x0);
              QVariant::QVariant((QVariant *)&local_b0,&local_78);
              (**(code **)(*(long *)this + 0x98))(this,&local_c8,&local_b0,2);
              QVariant::~QVariant((QVariant *)&local_b0);
              if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
                }
              }
              if (local_90[0] != (QArrayData *)0x0) {
                LOCK();
                (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_90[0],2,8);
                }
              }
              if (local_e0 != (QArrayData *)0x0) {
                LOCK();
                (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_e0,2,8);
                }
              }
              if (local_60 != (QArrayData *)0x0) {
                LOCK();
                (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_60,2,8);
                }
              }
              (**(code **)(*(long *)this + 0x60))
                        (&local_c8,this,uVar2 & 0xffffffff,uVar3 & 0xffffffff,local_48);
              QVariant::QVariant((QVariant *)&local_b0,(int)uVar3);
              (**(code **)(*(long *)this + 0x98))(this,&local_c8,&local_b0,0x100);
              QVariant::~QVariant((QVariant *)&local_b0);
              (**(code **)(*(long *)this + 0x60))
                        (&local_c8,this,uVar2 & 0xffffffff,uVar3 & 0xffffffff,local_48);
              QVariant::QVariant((QVariant *)&local_b0,(int)uVar2);
              (**(code **)(*(long *)this + 0x98))(this,&local_c8,&local_b0);
              QVariant::~QVariant((QVariant *)&local_b0);
              uVar3 = uVar3 + 1;
              iVar1 = (**(code **)(*(long *)this + 0x80))(this,local_48);
            } while ((long)uVar3 < (long)iVar1);
          }
          uVar2 = uVar2 + 1;
          iVar1 = (**(code **)(*(long *)this + 0x78))(this,local_48);
        } while ((long)uVar2 < (long)iVar1);
      }
      uVar2 = local_e8 + 1;
      local_b0._forAlignment = -NAN;
      local_b0._8_8_ = 0;
      local_b0._16_8_ = 0;
      iVar1 = (**(code **)(*(long *)this + 0x78))(this,&local_b0);
    } while ((long)uVar2 < (long)iVar1);
  }
  return (QAbstractItemModel *)this;
}

Assistant:

QAbstractItemModel *createTreeModel(QObject *parent)
{
    QAbstractItemModel *result = nullptr;
#ifdef COMPLEX_MODEL_SUPPORT
    result = new ComplexModel(parent);
    result->insertRows(0, 5);
    result->insertColumns(0, 3);
    for (int i = 0; i < result->rowCount(); ++i) {
        for (int j = 0; j < result->columnCount(); ++j) {
            result->setData(result->index(i, j), QStringLiteral("%1,%2").arg(i).arg(j), Qt::EditRole);
            result->setData(result->index(i, j), i, Qt::UserRole);
            result->setData(result->index(i, j), j, Qt::UserRole + 1);
        }
        const QModelIndex parIdx = result->index(i, 0);
        result->insertRows(0, 5, parIdx);
        result->insertColumns(0, 3, parIdx);
        for (int k = 0; k < result->rowCount(parIdx); ++k) {
            for (int h = 0; h < result->columnCount(parIdx); ++h) {
                result->setData(result->index(k, h, parIdx), QStringLiteral("%1,%2,%3").arg(i).arg(k).arg(h), Qt::EditRole);
                result->setData(result->index(k, h, parIdx), h, Qt::UserRole);
                result->setData(result->index(k, h, parIdx), k, Qt::UserRole + 1);
            }
        }
    }
#endif
    return result;
}